

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2f151d::Db::Db(Db *this,char *First_,char *Last_)

{
  char *Last__local;
  char *First__local;
  Db *this_local;
  
  this->First = First_;
  this->Last = Last_;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::PODSmallVector(&this->Names);
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::PODSmallVector(&this->Subs);
  PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::PODSmallVector(&this->TemplateParams);
  PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL>::PODSmallVector
            (&this->ForwardTemplateRefs);
  this->TypeCallback = (_func_void_void_ptr_char_ptr *)0x0;
  this->TypeCallbackContext = (void *)0x0;
  this->TryToParseTemplateArgs = true;
  this->PermitForwardTemplateReferences = false;
  this->ParsingLambdaParams = false;
  BumpPointerAllocator::BumpPointerAllocator(&this->ASTAllocator);
  return;
}

Assistant:

Db(const char *First_, const char *Last_) : First(First_), Last(Last_) {}